

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_rcu_list.h
# Opt level: O0

void __thiscall
libguarded::
rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::
~rcu_list(rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
          *this)

{
  __pointer_type pnVar1;
  __pointer_type pzVar2;
  __pointer_type prVar3;
  bool bVar4;
  zombie_list_node *current_1;
  zombie_list_node *zn;
  node *current;
  node *n;
  rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
  *this_local;
  
  pnVar1 = std::
           atomic<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*>
           ::load(&this->m_head,seq_cst);
  while (current = pnVar1, current != (node *)0x0) {
    pnVar1 = std::
             atomic<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*>
             ::load(&current->next,seq_cst);
    if (current != (node *)0x0) {
      std::
      allocator_traits<std::allocator<libguarded::rcu_list<CsSignal::SignalBase_const*,std::mutex,std::allocator<CsSignal::SignalBase_const*>>::node>>
      ::
      destroy<libguarded::rcu_list<CsSignal::SignalBase_const*,std::mutex,std::allocator<CsSignal::SignalBase_const*>>::node>
                ((allocator_type *)&this->field_0x40,current);
      std::
      allocator_traits<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>
      ::deallocate((allocator_type *)&this->field_0x40,current,1);
    }
  }
  pzVar2 = std::
           atomic<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::zombie_list_node_*>
           ::load(&this->m_zombie_head,seq_cst);
  while( true ) {
    current_1 = pzVar2;
    bVar4 = false;
    if (current_1 != (zombie_list_node *)0x0) {
      prVar3 = std::
               atomic<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::rcu_guard_*>
               ::load(&current_1->owner,seq_cst);
      bVar4 = prVar3 == (__pointer_type)0x0;
    }
    if (!bVar4) break;
    pzVar2 = std::
             atomic<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::zombie_list_node_*>
             ::load(&current_1->next,seq_cst);
    if (current_1->zombie_node != (node *)0x0) {
      std::
      allocator_traits<std::allocator<libguarded::rcu_list<CsSignal::SignalBase_const*,std::mutex,std::allocator<CsSignal::SignalBase_const*>>::node>>
      ::
      destroy<libguarded::rcu_list<CsSignal::SignalBase_const*,std::mutex,std::allocator<CsSignal::SignalBase_const*>>::node>
                ((allocator_type *)&this->field_0x40,current_1->zombie_node);
      std::
      allocator_traits<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>
      ::deallocate((allocator_type *)&this->field_0x40,current_1->zombie_node,1);
    }
    if (current_1 != (zombie_list_node *)0x0) {
      std::
      allocator_traits<std::allocator<libguarded::rcu_list<CsSignal::SignalBase_const*,std::mutex,std::allocator<CsSignal::SignalBase_const*>>::zombie_list_node>>
      ::
      destroy<libguarded::rcu_list<CsSignal::SignalBase_const*,std::mutex,std::allocator<CsSignal::SignalBase_const*>>::zombie_list_node>
                ((allocator_type *)&this->field_0x41,current_1);
      std::
      allocator_traits<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::zombie_list_node>_>
      ::deallocate((allocator_type *)&this->field_0x41,current_1,1);
    }
  }
  std::
  allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::zombie_list_node>
  ::~allocator((allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::zombie_list_node>
                *)&this->field_0x41);
  std::
  allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>
  ::~allocator((allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>
                *)&this->field_0x40);
  return;
}

Assistant:

rcu_list<T, M, Alloc>::~rcu_list()
{
   node *n = m_head.load();

   while (n != nullptr) {
      node *current = n;
      n = n->next.load();

      if (current != nullptr) {
         node_alloc_trait::destroy(m_node_alloc, current);
         node_alloc_trait::deallocate(m_node_alloc, current, 1);
      }
   }

   zombie_list_node *zn = m_zombie_head.load();

   while (zn != nullptr && zn->owner.load() == nullptr) {
      zombie_list_node *current = zn;
      zn = zn->next.load();

      if (current->zombie_node != nullptr) {
         node_alloc_trait::destroy(m_node_alloc, current->zombie_node);
         node_alloc_trait::deallocate(m_node_alloc, current->zombie_node, 1);
      }

      if (current != nullptr) {
         zombie_alloc_trait::destroy(m_zombie_alloc, current);
         zombie_alloc_trait::deallocate(m_zombie_alloc, current, 1);
      }
   }
}